

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O2

__uint128_t * kmer_cannonical128(__uint128_t *__return_storage_ptr__,__uint128_t kmer,uint8_t k)

{
  undefined1 kmer_00 [16];
  undefined8 in_RAX;
  __uint128_t *p_Var1;
  ulong extraout_RDX;
  undefined8 unaff_RBX;
  undefined7 in_register_00000031;
  
  kmer_00._8_8_ = unaff_RBX;
  kmer_00._0_8_ = in_RAX;
  p_Var1 = kmer_reverse128(__return_storage_ptr__,(__uint128_t)kmer_00,k);
  if (CONCAT71(in_register_00000031,k) <= extraout_RDX &&
      (ulong)(p_Var1 < __return_storage_ptr__) <= extraout_RDX - CONCAT71(in_register_00000031,k)) {
    p_Var1 = __return_storage_ptr__;
  }
  return p_Var1;
}

Assistant:

__uint128_t kmer_cannonical128(__uint128_t kmer, uint8_t k) {
    __uint128_t rkmer=kmer_reverse128(kmer,k);
    return (rkmer<kmer ? rkmer:kmer);
}